

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     PrintWithFallback<google::protobuf::descriptor_unittest::ExtensionDeclarationsTestParams>
               (ExtensionDeclarationsTestParams *value,ostream *os)

{
  ostream *os_local;
  ExtensionDeclarationsTestParams *value_local;
  
  RawBytesPrinter::
  PrintValue<google::protobuf::descriptor_unittest::ExtensionDeclarationsTestParams,32ul>(value,os);
  return;
}

Assistant:

void PrintWithFallback(const T& value, ::std::ostream* os) {
  using Printer = typename FindFirstPrinter<
      T, void, ContainerPrinter, FunctionPointerPrinter, PointerPrinter,
      ProtobufPrinter,
#ifdef GTEST_HAS_ABSL
      ConvertibleToAbslStringifyPrinter,
#endif  // GTEST_HAS_ABSL
      internal_stream_operator_without_lexical_name_lookup::StreamPrinter,
      ConvertibleToIntegerPrinter, ConvertibleToStringViewPrinter,
      RawBytesPrinter, FallbackPrinter>::type;
  Printer::PrintValue(value, os);
}